

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

bool __thiscall
cbtQuantizedBvh::serialize
          (cbtQuantizedBvh *this,void *o_alignedDataBuffer,uint param_2,bool i_swapEndian)

{
  void *buffer;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  cbtQuantizedBvhNode *pcVar7;
  long lVar8;
  cbtOptimizedBvhNode *pcVar9;
  cbtBvhSubtreeInfo *pcVar10;
  undefined8 uVar11;
  cbtTraversalMode cVar12;
  int iVar13;
  undefined7 in_register_00000009;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  cbtQuantizedBvh((cbtQuantizedBvh *)o_alignedDataBuffer);
  if ((int)CONCAT71(in_register_00000009,i_swapEndian) == 0) {
    *(int *)((long)o_alignedDataBuffer + 0x3c) = this->m_curNodeIndex;
    uVar11 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 8) = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x10) = uVar11;
    uVar11 = *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x18) = *(undefined8 *)(this->m_bvhAabbMax).m_floats
    ;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x20) = uVar11;
    uVar11 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x28) =
         *(undefined8 *)(this->m_bvhQuantization).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x30) = uVar11;
    cVar12 = this->m_traversalMode;
    iVar13 = this->m_subtreeHeaderCount;
  }
  else {
    uVar4 = swap_bytes(this->m_curNodeIndex);
    *(undefined4 *)((long)o_alignedDataBuffer + 0x3c) = uVar4;
    cbtSwapVector3Endian(&this->m_bvhAabbMin,(cbtVector3 *)((long)o_alignedDataBuffer + 8));
    cbtSwapVector3Endian(&this->m_bvhAabbMax,(cbtVector3 *)((long)o_alignedDataBuffer + 0x18));
    cbtSwapVector3Endian(&this->m_bvhQuantization,(cbtVector3 *)((long)o_alignedDataBuffer + 0x28));
    cVar12 = swap_bytes(this->m_traversalMode);
    iVar13 = swap_bytes(this->m_subtreeHeaderCount);
  }
  *(cbtTraversalMode *)((long)o_alignedDataBuffer + 200) = cVar12;
  *(int *)((long)o_alignedDataBuffer + 0xf0) = iVar13;
  buffer = (void *)((long)o_alignedDataBuffer + 0xf8);
  bVar5 = this->m_useQuantization;
  *(bool *)((long)o_alignedDataBuffer + 0x40) = bVar5;
  uVar6 = this->m_curNodeIndex;
  if (bVar5 == true) {
    cbtAlignedObjectArray<cbtQuantizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),
               buffer,uVar6,uVar6);
    pcVar7 = (this->m_quantizedContiguousNodes).m_data;
    lVar15 = 0;
    lVar14 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6) << 4;
    if (i_swapEndian) {
      for (; lVar14 != lVar15; lVar15 = lVar15 + 0x10) {
        lVar8 = *(long *)((long)o_alignedDataBuffer + 0xb8);
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15));
        *(undefined2 *)(lVar8 + lVar15) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15 + 2));
        *(undefined2 *)(lVar8 + 2 + lVar15) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15 + 4));
        *(undefined2 *)(lVar8 + 4 + lVar15) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15));
        *(undefined2 *)(lVar8 + 6 + lVar15) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 2));
        *(undefined2 *)(lVar8 + 8 + lVar15) = uVar3;
        uVar3 = swap_bytes(*(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 4));
        *(undefined2 *)(lVar8 + 10 + lVar15) = uVar3;
        uVar4 = swap_bytes(*(undefined4 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 6));
        *(undefined4 *)(lVar8 + 0xc + lVar15) = uVar4;
      }
    }
    else {
      for (; lVar14 != lVar15; lVar15 = lVar15 + 0x10) {
        lVar8 = *(long *)((long)o_alignedDataBuffer + 0xb8);
        *(undefined2 *)(lVar8 + lVar15) = *(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15)
        ;
        *(undefined2 *)(lVar8 + 2 + lVar15) =
             *(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15 + 2);
        *(undefined2 *)(lVar8 + 4 + lVar15) =
             *(undefined2 *)((long)pcVar7->m_quantizedAabbMin + lVar15 + 4);
        *(undefined2 *)(lVar8 + 6 + lVar15) =
             *(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15);
        *(undefined2 *)(lVar8 + 8 + lVar15) =
             *(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 2);
        *(undefined2 *)(lVar8 + 10 + lVar15) =
             *(undefined2 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 4);
        *(undefined4 *)(lVar8 + 0xc + lVar15) =
             *(undefined4 *)((long)pcVar7->m_quantizedAabbMax + lVar15 + 6);
      }
    }
    lVar14 = (long)(int)uVar6 << 4;
    cbtAlignedObjectArray<cbtQuantizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),
               (void *)0x0,0,0);
  }
  else {
    cbtAlignedObjectArray<cbtOptimizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),
               buffer,uVar6,uVar6);
    lVar14 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6) << 6;
    if (i_swapEndian) {
      for (lVar15 = 0; lVar14 != lVar15; lVar15 = lVar15 + 0x40) {
        cbtSwapVector3Endian
                  ((cbtVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar15),
                   (cbtVector3 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + lVar15));
        cbtSwapVector3Endian
                  ((cbtVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar15),
                   (cbtVector3 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + 0x10 + lVar15));
        pcVar9 = (this->m_contiguousNodes).m_data;
        lVar8 = *(long *)((long)o_alignedDataBuffer + 0x78);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)(pcVar9->m_padding + lVar15 + -0xc);
        auVar16 = vpshufb_avx(auVar16,_DAT_00f5c800);
        *(long *)(lVar8 + 0x20 + lVar15) = auVar16._0_8_;
        uVar4 = swap_bytes(*(undefined4 *)(pcVar9->m_padding + lVar15 + -4));
        *(undefined4 *)(lVar8 + 0x28 + lVar15) = uVar4;
      }
    }
    else {
      for (lVar15 = 0; lVar14 != lVar15; lVar15 = lVar15 + 0x40) {
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar15);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar15);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + 0x10 + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        pcVar9 = (this->m_contiguousNodes).m_data;
        lVar8 = *(long *)((long)o_alignedDataBuffer + 0x78);
        *(undefined8 *)(lVar8 + 0x20 + lVar15) = *(undefined8 *)(pcVar9->m_padding + lVar15 + -0xc);
        *(undefined4 *)(lVar8 + 0x28 + lVar15) = *(undefined4 *)(pcVar9->m_padding + lVar15 + -4);
      }
    }
    lVar14 = (long)(int)uVar6 << 6;
    cbtAlignedObjectArray<cbtOptimizedBvhNode>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),
               (void *)0x0,0,0);
  }
  cbtAlignedObjectArray<cbtBvhSubtreeInfo>::initializeFromBuffer
            ((cbtAlignedObjectArray<cbtBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)((long)buffer + lVar14),this->m_subtreeHeaderCount,this->m_subtreeHeaderCount);
  if (i_swapEndian) {
    uVar6 = this->m_subtreeHeaderCount;
    pcVar10 = (this->m_SubtreeHeaders).m_data;
    for (lVar14 = 0; (ulong)(~((int)uVar6 >> 0x1f) & uVar6) << 5 != lVar14; lVar14 = lVar14 + 0x20)
    {
      lVar15 = *(long *)((long)o_alignedDataBuffer + 0xe0);
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14));
      *(undefined2 *)(lVar15 + lVar14) = uVar3;
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 2));
      *(undefined2 *)(lVar15 + 2 + lVar14) = uVar3;
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 4));
      *(undefined2 *)(lVar15 + 4 + lVar14) = uVar3;
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14));
      *(undefined2 *)(lVar15 + 6 + lVar14) = uVar3;
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 2));
      *(undefined2 *)(lVar15 + 8 + lVar14) = uVar3;
      uVar3 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 4));
      *(undefined2 *)(lVar15 + 10 + lVar14) = uVar3;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 6);
      auVar16 = vpshufb_avx(auVar17,ZEXT816(0x405060700010203));
      *(long *)(lVar15 + 0xc + lVar14) = auVar16._0_8_;
    }
  }
  else {
    pcVar10 = (this->m_SubtreeHeaders).m_data;
    lVar14 = 0;
    for (lVar15 = 0; lVar15 < this->m_subtreeHeaderCount; lVar15 = lVar15 + 1) {
      lVar8 = *(long *)((long)o_alignedDataBuffer + 0xe0);
      *(undefined2 *)(lVar8 + lVar14) = *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14);
      *(undefined2 *)(lVar8 + 2 + lVar14) =
           *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 2);
      *(undefined2 *)(lVar8 + 4 + lVar14) =
           *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 4);
      *(undefined2 *)(lVar8 + 6 + lVar14) =
           *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14);
      *(undefined2 *)(lVar8 + 8 + lVar14) =
           *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 2);
      *(undefined2 *)(lVar8 + 10 + lVar14) =
           *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 4);
      *(undefined8 *)(lVar8 + 0xc + lVar14) =
           *(undefined8 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 6);
      *(undefined8 *)(lVar8 + 0x14 + lVar14) = 0;
      *(undefined4 *)(lVar8 + 0x1c + lVar14) = 0;
      lVar14 = lVar14 + 0x20;
    }
  }
  cbtAlignedObjectArray<cbtBvhSubtreeInfo>::initializeFromBuffer
            ((cbtAlignedObjectArray<cbtBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)0x0,0,0);
  *(undefined8 *)o_alignedDataBuffer = 0;
  return true;
}

Assistant:

bool cbtQuantizedBvh::serialize(void* o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	cbtAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		cbtAssert(0);
		return false;
	}
*/

	cbtQuantizedBvh* targetBvh = (cbtQuantizedBvh*)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) cbtQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(cbtSwapEndian(m_curNodeIndex));

		cbtSwapVector3Endian(m_bvhAabbMin, targetBvh->m_bvhAabbMin);
		cbtSwapVector3Endian(m_bvhAabbMax, targetBvh->m_bvhAabbMax);
		cbtSwapVector3Endian(m_bvhQuantization, targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (cbtTraversalMode)cbtSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(cbtSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char* nodeData = (unsigned char*)targetBvh;
	nodeData += sizeof(cbtQuantizedBvh);

	unsigned sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;
			}
		}
		nodeData += sizeof(cbtQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(cbtOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(cbtBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}